

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O0

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHashAndCountVariables
          (HashingClauseVariantIndex *this,Literal *l,VarCounts *varCnts,uint hash_begin)

{
  bool bVar1;
  uint uVar2;
  Comparison CVar3;
  undefined4 in_ECX;
  Term *in_RSI;
  Literal *in_RDI;
  TermList *arg;
  TermList *lr;
  TermList *ll;
  uint hash;
  uint header;
  uint in_stack_ffffffffffffffac;
  TermList *local_48;
  TermList *local_40;
  TermList *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  type local_4;
  
  bVar1 = Kernel::Term::ground((Term *)0x2fef1b);
  if (bVar1) {
    local_4 = Lib::DefaultHash::hash<Kernel::Literal>(in_RDI,in_stack_ffffffffffffffac);
  }
  else {
    uVar2 = Kernel::Literal::header(in_RDI);
    local_4 = Lib::DefaultHash::hash<unsigned_int>(0,0x2fef53);
    bVar1 = Kernel::Literal::isEquality((Literal *)0x2fef61);
    if (bVar1) {
      local_38 = Kernel::Term::nthArgument(in_RSI,0);
      local_40 = Kernel::Term::nthArgument(in_RSI,1);
      CVar3 = VariableIgnoringComparator::compare
                        ((TermList *)CONCAT44(in_ECX,uVar2),
                         (TermList *)CONCAT44(local_4,in_stack_ffffffffffffffd0));
      if (CVar3 == LESS) {
        std::swap<Kernel::TermList*>(&local_38,&local_40);
      }
      computeHashAndCountVariables(this,(TermList *)l,varCnts,hash_begin);
      local_4 = computeHashAndCountVariables(this,(TermList *)l,varCnts,hash_begin);
    }
    else {
      local_48 = Kernel::Term::args(in_RSI);
      while (bVar1 = Kernel::TermList::isNonEmpty((TermList *)0x2ff005), bVar1) {
        local_4 = computeHashAndCountVariables(this,(TermList *)l,varCnts,hash_begin);
        local_48 = Kernel::TermList::next(local_48);
      }
    }
  }
  return local_4;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHashAndCountVariables(Literal* l, VarCounts& varCnts, unsigned hash_begin) {
  //cout << "Literal " << l->toString() << endl;

  if (l->ground()) {
    // no variables to count
    // just hash the pointer
    return DefaultHash::hash(l, hash_begin);
  }

  //cout << "will hash header " << header << endl;

  unsigned header = l->header();

  // hashes the predicate symbol and the polarity
  unsigned hash = DefaultHash::hash(header, hash_begin);

  if(l->isEquality()) {
    TermList* ll = l->nthArgument(0);
    TermList* lr = l->nthArgument(1);
    if (VariableIgnoringComparator::compare(ll,lr) == LESS) {
      swap(ll,lr);
    }

    hash = computeHashAndCountVariables(ll,varCnts,hash);
    hash = computeHashAndCountVariables(lr,varCnts,hash);
  } else {
    for(TermList* arg=l->args(); arg->isNonEmpty(); arg=arg->next()) {
      hash = computeHashAndCountVariables(arg,varCnts,hash);
    }
  }

  return hash;
}